

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O1

bool __thiscall Potassco::AspifInput::doAttach(AspifInput *this,bool *inc)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  BufferedStream *pBVar4;
  
  pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
  BufferedStream::skipWs(pBVar4);
  bVar1 = BufferedStream::match(pBVar4,"asp ");
  if (bVar1) {
    uVar3 = ProgramReader::matchPos
                      (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
    ProgramReader::require(&this->super_ProgramReader,uVar3 == 1,"unsupported major version");
    uVar3 = ProgramReader::matchPos
                      (&this->super_ProgramReader,0xffffffff,"unsigned integer expected");
    ProgramReader::require(&this->super_ProgramReader,uVar3 == 0,"unsupported minor version");
    ProgramReader::matchPos(&this->super_ProgramReader,0xffffffff,"revision number expected");
    do {
      pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
      bVar1 = BufferedStream::match(pBVar4," ");
    } while (bVar1);
    pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
    bVar1 = BufferedStream::match(pBVar4,"incremental");
    *inc = bVar1;
    (*this->out_->_vptr_AbstractProgram[2])(this->out_,(ulong)bVar1);
    pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
    cVar2 = BufferedStream::get(pBVar4);
    bVar1 = ProgramReader::require
                      (&this->super_ProgramReader,cVar2 == '\n',
                       "invalid extra characters in problem line");
    return bVar1;
  }
  return false;
}

Assistant:

bool AspifInput::doAttach(bool& inc) {
	if (!match("asp ")) { return false; }
	require(matchPos() == 1, "unsupported major version");
	require(matchPos() == 0, "unsupported minor version");
	matchPos("revision number expected");
	while (match(" ", false)) { ; }
	inc  = match("incremental", false);
	out_.initProgram(inc);
	return require(stream()->get() == '\n', "invalid extra characters in problem line");
}